

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O3

LispPTR reclaimarrayblock(LispPTR ptr)

{
  uint block;
  DLword *pDVar1;
  DLword *pDVar2;
  ushort uVar3;
  ulong uVar4;
  LispPTR LVar5;
  int iVar6;
  
  block = ptr - 2;
  uVar4 = (ulong)block;
  if ((ptr & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar4);
  }
  pDVar1 = Lisp_world;
  if (((ptr & 0xfff0000) < 0x130000) || ((Lisp_world[uVar4 + 1] & 0xfff9) != 0xaaa9)) {
    error("Bad array block reclaimed--continue with \'q\' but save state ASAP. \n");
  }
  else {
    uVar3 = Lisp_world[uVar4 + 1] >> 1 & 3;
    if (uVar3 == 2) {
      LVar5 = reclaimcodeblock(ptr);
      if (LVar5 != 0) {
        return 1;
      }
    }
    else if (uVar3 == 1) {
      iVar6 = (uint)Lisp_world[uVar4] * 2 + -4;
      LVar5 = ptr;
      do {
        if ((ptr & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar5);
        }
        pDVar2 = Lisp_world;
        if ((-1 < *(short *)((ulong)(*(uint *)(Lisp_world + LVar5) >> 8 & 0xfffffffe) +
                             (long)MDStypetbl ^ 2)) && (*GcDisabled_word != 0x4c)) {
          rec_htfind(*(uint *)(Lisp_world + LVar5),1);
        }
        (pDVar2 + LVar5)[0] = 0;
        (pDVar2 + LVar5)[1] = 0;
        LVar5 = LVar5 + 2;
        iVar6 = iVar6 + -2;
      } while (iVar6 != 0);
    }
    makefreearrayblock(block,pDVar1[uVar4]);
    LVar5 = mergebackward(block);
    mergeforward(LVar5);
  }
  return 1;
}

Assistant:

LispPTR reclaimarrayblock(LispPTR ptr) {
  LispPTR tmpptr, btrailer;
  struct arrayblock *base;
  LispPTR *tmpp;
  int reclaim_p;

  reclaim_p = T;
#ifdef ARRAYCHECK
  checkarrayblock(ptr - ARRAYBLOCKHEADERWORDS, NIL, NIL);
#endif /* ARRAYCHECK */

  base = (struct arrayblock *)NativeAligned4FromLAddr(ptr - ARRAYBLOCKHEADERWORDS);
#ifdef ARRAYCHECK
  if (HILOC(ptr) < FIRSTARRAYSEGMENT) {
    printarrayblock(ptr - ARRAYBLOCKHEADERWORDS);
    error(
        "Bad array block reclaimed [not in array space].\nContinue with 'q' but save state ASAP. "
        "\n");
    return (T);
  } else if (ARRAYBLOCKPASSWORD != base->password) {
    printarrayblock(ptr - ARRAYBLOCKHEADERWORDS);
    error("Bad array block reclaimed [password wrong].\nContinue with 'q' but save state ASAP. \n");
    return (T);
  } else if (base->inuse == NIL) {
    printarrayblock(ptr - ARRAYBLOCKHEADERWORDS);
    error(
        "Bad array block reclaimed [block not in use].\nContinue with 'q' but save state ASAP. \n");
    return (T);
  }
#else
  /* Normal case, just tell the guy something's wrong: */
  if ((HILOC(ptr) < FIRSTARRAYSEGMENT) ||
      ((ARRAYBLOCKPASSWORD != base->password) || (base->inuse == NIL))) {
    error("Bad array block reclaimed--continue with 'q' but save state ASAP. \n");
    return (T);
  }
#endif /* ARRAYCHECK */

  switch (base->gctype) {
    case PTRBLOCK_GCT: {
      btrailer = (ptr - 2) + 2 * (base->arlen - ARRAYBLOCKTRAILERCELLS);
      tmpptr = ptr;
      do {
        tmpp = (LispPTR *)NativeAligned4FromLAddr(tmpptr);
        /* GCLOOKUP(0x8000,DELREF, *tmpp);*/ /* added 8-Oct-87 TT */
        REC_GCLOOKUP(*tmpp, DELREF);
        *tmpp = NIL;
        tmpptr += 2;
      } while (tmpptr != btrailer);
      break;
    }
    case CODEBLOCK_GCT:
      reclaim_p = ((reclaimcodeblock(ptr) == NIL) ? T : NIL);

      /* default:   No Action */
  }
  if (reclaim_p == T)
    mergeforward(mergebackward(makefreearrayblock(ptr - ARRAYBLOCKHEADERWORDS, base->arlen)));
  return (T);
}